

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torcontrol.cpp
# Opt level: O0

void TorControlConnection::readcb(bufferevent *bev,void *ctx)

{
  string_view str;
  string_view source_file;
  string_view source_file_00;
  bool bVar1;
  long lVar2;
  void *__ptr;
  size_type sVar3;
  ulong uVar4;
  ConstevalFormatString<1U> in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  Level in_stack_00000020;
  int *in_stack_00000030;
  char ch;
  char *line;
  evbuffer *input;
  TorControlConnection *self;
  size_t n_read_out;
  string s;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffe7c;
  char *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  allocator<char> *in_stack_fffffffffffffe90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  _Optional_payload_base<int> in_stack_fffffffffffffec0;
  LogFlags in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  int source_line;
  char *pcVar6;
  string_view in_stack_ffffffffffffff40;
  allocator<char> local_79;
  undefined8 local_78;
  _Optional_payload_base<int> local_70;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar6 = in_RSI.fmt;
  lVar2 = bufferevent_get_input(in_RDI);
  local_78 = 0;
  if (lVar2 == 0) {
    __assert_fail("input",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/torcontrol.cpp"
                  ,0x59,"static void TorControlConnection::readcb(struct bufferevent *, void *)");
  }
  while( true ) {
    __ptr = (void *)evbuffer_readln(lVar2,&local_78,1);
    source_line = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    if (__ptr == (void *)0x0) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (in_stack_fffffffffffffea8,
               (char *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
               (size_type)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    std::allocator<char>::~allocator(&local_79);
    free(__ptr);
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    if (3 < sVar3) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                 (size_type)in_stack_fffffffffffffe98,(size_type)in_stack_fffffffffffffe90);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe98);
      str._M_len._4_4_ = in_stack_fffffffffffffebc;
      str._M_len._0_4_ = in_stack_fffffffffffffeb8;
      str._M_str = (char *)in_stack_fffffffffffffec0;
      in_stack_fffffffffffffec0 = (_Optional_payload_base<int>)ToIntegral<int>(str);
      local_70 = in_stack_fffffffffffffec0;
      in_stack_fffffffffffffebc =
           std::optional<int>::value_or<int>
                     ((optional<int> *)in_stack_fffffffffffffe90,(int *)in_stack_fffffffffffffe88);
      *(int *)(in_RSI.fmt + 0x50) = in_stack_fffffffffffffebc;
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                 (size_type)in_stack_fffffffffffffe98,(size_type)in_stack_fffffffffffffe90);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                  (value_type *)0x742f86);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      in_stack_fffffffffffffea8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[](in_stack_fffffffffffffe88,(size_type)in_stack_fffffffffffffe80);
      if (*(char *)&(in_stack_fffffffffffffea8->_M_dataplus)._M_p == ' ') {
        if (*(int *)(in_RSI.fmt + 0x50) < 600) {
          bVar1 = std::
                  deque<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>,_std::allocator<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>_>_>
                  ::empty((deque<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>,_std::allocator<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>_>_>
                           *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
          if (bVar1) {
            in_stack_fffffffffffffea7 =
                 ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                                     Trace);
            if ((bool)in_stack_fffffffffffffea7) {
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90);
              std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                        ((basic_string_view<char,_std::char_traits<char>_> *)
                         in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90);
              in_stack_fffffffffffffee8 = 0;
              in_stack_fffffffffffffe88 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (in_RSI.fmt + 0x50);
              in_stack_fffffffffffffe80 = "Received unexpected sync reply %i\n";
              in_stack_fffffffffffffe78 = 1;
              source_file._M_str = in_RDI;
              source_file._M_len = (size_t)pcVar6;
              LogPrintFormatInternal<int>
                        (in_stack_ffffffffffffff40,source_file,0,in_stack_fffffffffffffee0,
                         in_stack_00000020,in_RSI,in_stack_00000030);
            }
          }
          else {
            std::
            deque<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>,_std::allocator<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>_>_>
            ::front((deque<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>,_std::allocator<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>_>_>
                     *)in_stack_fffffffffffffe88);
            std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>::operator()
                      ((function<void_(TorControlConnection_&,_const_TorControlReply_&)> *)
                       in_stack_fffffffffffffe88,(TorControlConnection *)in_stack_fffffffffffffe80,
                       (TorControlReply *)
                       CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
            std::
            deque<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>,_std::allocator<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>_>_>
            ::pop_front((deque<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>,_std::allocator<std::function<void_(TorControlConnection_&,_const_TorControlReply_&)>_>_>
                         *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
          }
        }
        TorControlReply::Clear
                  ((TorControlReply *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
        ;
      }
    }
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  }
  uVar4 = evbuffer_get_length(lVar2);
  if (100000 < uVar4) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe98,
               (char *)in_stack_fffffffffffffe90);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe98,
               (char *)in_stack_fffffffffffffe90);
    uVar5 = 2;
    source_file_00._M_str = in_RDI;
    source_file_00._M_len = (size_t)pcVar6;
    LogPrintFormatInternal<>
              (in_stack_ffffffffffffff40,source_file_00,source_line,0x110f34d,in_stack_00000020,
               (ConstevalFormatString<0U>)in_RSI.fmt);
    Disconnect((TorControlConnection *)CONCAT44(in_stack_fffffffffffffe7c,uVar5));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TorControlConnection::readcb(struct bufferevent *bev, void *ctx)
{
    TorControlConnection *self = static_cast<TorControlConnection*>(ctx);
    struct evbuffer *input = bufferevent_get_input(bev);
    size_t n_read_out = 0;
    char *line;
    assert(input);
    //  If there is not a whole line to read, evbuffer_readln returns nullptr
    while((line = evbuffer_readln(input, &n_read_out, EVBUFFER_EOL_CRLF)) != nullptr)
    {
        std::string s(line, n_read_out);
        free(line);
        if (s.size() < 4) // Short line
            continue;
        // <status>(-|+| )<data><CRLF>
        self->message.code = ToIntegral<int>(s.substr(0, 3)).value_or(0);
        self->message.lines.push_back(s.substr(4));
        char ch = s[3]; // '-','+' or ' '
        if (ch == ' ') {
            // Final line, dispatch reply and clean up
            if (self->message.code >= 600) {
                // (currently unused)
                // Dispatch async notifications to async handler
                // Synchronous and asynchronous messages are never interleaved
            } else {
                if (!self->reply_handlers.empty()) {
                    // Invoke reply handler with message
                    self->reply_handlers.front()(*self, self->message);
                    self->reply_handlers.pop_front();
                } else {
                    LogDebug(BCLog::TOR, "Received unexpected sync reply %i\n", self->message.code);
                }
            }
            self->message.Clear();
        }
    }
    //  Check for size of buffer - protect against memory exhaustion with very long lines
    //  Do this after evbuffer_readln to make sure all full lines have been
    //  removed from the buffer. Everything left is an incomplete line.
    if (evbuffer_get_length(input) > MAX_LINE_LENGTH) {
        LogPrintf("tor: Disconnecting because MAX_LINE_LENGTH exceeded\n");
        self->Disconnect();
    }
}